

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadStartSection(BinaryReader *this,Offset section_size)

{
  int iVar1;
  Result RVar2;
  char *format;
  uint32_t value;
  uint local_c;
  
  iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x2f])();
  if (iVar1 == 0) {
    RVar2 = ReadU32Leb128(this,&local_c,"start function index");
    if (RVar2.enum_ == Error) {
      return (Result)Error;
    }
    iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x30])(this->delegate_,(ulong)local_c);
    if (iVar1 == 0) {
      iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x31])();
      if (iVar1 == 0) {
        return (Result)Ok;
      }
      format = "EndStartSection callback failed";
    }
    else {
      format = "OnStartFunction callback failed";
    }
  }
  else {
    format = "BeginStartSection callback failed";
  }
  PrintError(this,format);
  return (Result)Error;
}

Assistant:

Result BinaryReader::ReadStartSection(Offset section_size) {
  CALLBACK(BeginStartSection, section_size);
  Index func_index;
  CHECK_RESULT(ReadIndex(&func_index, "start function index"));
  CALLBACK(OnStartFunction, func_index);
  CALLBACK0(EndStartSection);
  return Result::Ok;
}